

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O1

int smf_track_add_eot_pulses(smf_track_t *track,int pulses)

{
  smf_event_t *psVar1;
  int iVar2;
  
  if (track->number_of_events == 0) {
    psVar1 = (smf_event_t *)0x0;
  }
  else {
    psVar1 = smf_track_get_event_by_number(track,track->number_of_events);
  }
  if ((psVar1 == (smf_event_t *)0x0) || (iVar2 = -2, psVar1->time_pulses <= pulses)) {
    iVar2 = 0;
    psVar1 = smf_event_new_from_bytes(0xff,0x2f,0);
    if (psVar1 == (smf_event_t *)0x0) {
      iVar2 = -3;
    }
    else {
      smf_track_add_event_pulses(track,psVar1,pulses);
    }
  }
  return iVar2;
}

Assistant:

int
smf_track_add_eot_pulses(smf_track_t *track, int pulses)
{
	smf_event_t *event, *last_event;

	last_event = smf_track_get_last_event(track);
	if (last_event != NULL) {
		if (last_event->time_pulses > pulses)
			return (-2);
	}

	event = smf_event_new_from_bytes(0xFF, 0x2F, 0x00);
	if (event == NULL)
		return (-3);

	smf_track_add_event_pulses(track, event, pulses);

	return (0);
}